

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3BeginMethod(sqlite3_vtab *pVtab)

{
  int iVar1;
  
  *(undefined4 *)((long)&pVtab[4].pModule + 4) = 0;
  iVar1 = fts3SetHasStat((Fts3Table *)pVtab);
  return iVar1;
}

Assistant:

static int fts3BeginMethod(sqlite3_vtab *pVtab){
  Fts3Table *p = (Fts3Table*)pVtab;
  UNUSED_PARAMETER(pVtab);
  assert( p->pSegments==0 );
  assert( p->nPendingData==0 );
  assert( p->inTransaction!=1 );
  TESTONLY( p->inTransaction = 1 );
  TESTONLY( p->mxSavepoint = -1; );
  p->nLeafAdd = 0;
  return fts3SetHasStat(p);
}